

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NullReader.cpp
# Opt level: O1

void __thiscall adios2::core::engine::NullReader::EndStep(NullReader *this)

{
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  if (((this->Impl)._M_t.
       super___uniq_ptr_impl<adios2::core::engine::NullReader::NullReaderImpl,_std::default_delete<adios2::core::engine::NullReader::NullReaderImpl>_>
       ._M_t.
       super__Tuple_impl<0UL,_adios2::core::engine::NullReader::NullReaderImpl_*,_std::default_delete<adios2::core::engine::NullReader::NullReaderImpl>_>
       .super__Head_base<0UL,_adios2::core::engine::NullReader::NullReaderImpl_*,_false>.
      _M_head_impl)->IsOpen == false) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Engine","");
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"NullReader","");
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"EndStep","");
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a8,"NullReader::EndStep: Engine already closed","");
    helper::Throw<std::runtime_error>(&local_48,&local_68,&local_88,&local_a8,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  if (((this->Impl)._M_t.
       super___uniq_ptr_impl<adios2::core::engine::NullReader::NullReaderImpl,_std::default_delete<adios2::core::engine::NullReader::NullReaderImpl>_>
       ._M_t.
       super__Tuple_impl<0UL,_adios2::core::engine::NullReader::NullReaderImpl_*,_std::default_delete<adios2::core::engine::NullReader::NullReaderImpl>_>
       .super__Head_base<0UL,_adios2::core::engine::NullReader::NullReaderImpl_*,_false>.
      _M_head_impl)->IsInStep == false) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Engine","");
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"NullReader","");
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"EndStep","");
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a8,"NullReader::EndStep: No active step","");
    helper::Throw<std::runtime_error>(&local_48,&local_68,&local_88,&local_a8,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  ((this->Impl)._M_t.
   super___uniq_ptr_impl<adios2::core::engine::NullReader::NullReaderImpl,_std::default_delete<adios2::core::engine::NullReader::NullReaderImpl>_>
   ._M_t.
   super__Tuple_impl<0UL,_adios2::core::engine::NullReader::NullReaderImpl_*,_std::default_delete<adios2::core::engine::NullReader::NullReaderImpl>_>
   .super__Head_base<0UL,_adios2::core::engine::NullReader::NullReaderImpl_*,_false>._M_head_impl)->
  IsInStep = false;
  return;
}

Assistant:

void NullReader::EndStep()
{
    if (!Impl->IsOpen)
    {
        helper::Throw<std::runtime_error>("Engine", "NullReader", "EndStep",
                                          "NullReader::EndStep: Engine already closed");
    }

    if (!Impl->IsInStep)
    {
        helper::Throw<std::runtime_error>("Engine", "NullReader", "EndStep",
                                          "NullReader::EndStep: No active step");
    }

    Impl->IsInStep = false;
}